

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_enc.c
# Opt level: O2

int WebPPictureAlloc(WebPPicture *picture)

{
  int iVar1;
  
  if (picture == (WebPPicture *)0x0) {
    return 1;
  }
  WebPPictureFree(picture);
  if (picture->use_argb != 0) {
    iVar1 = WebPPictureAllocARGB(picture);
    return iVar1;
  }
  iVar1 = WebPPictureAllocYUVA(picture);
  return iVar1;
}

Assistant:

int WebPPictureAlloc(WebPPicture* picture) {
  if (picture != NULL) {
    WebPPictureFree(picture);   // erase previous buffer

    if (!picture->use_argb) {
      return WebPPictureAllocYUVA(picture);
    } else {
      return WebPPictureAllocARGB(picture);
    }
  }
  return 1;
}